

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

bool __thiscall Js::AsmJsFunctionInfo::Init(AsmJsFunctionInfo *this,AsmJsFunc *func)

{
  AsmJsVarType type;
  ArgSlot AVar1;
  FunctionBody *pFVar2;
  ScriptContext *this_00;
  Recycler *pRVar3;
  Which *ptr;
  unsigned_short *puVar4;
  uint *ptr_00;
  BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  AsmJsType *pAVar5;
  ArgSlot local_da;
  AsmJsType varType;
  ArgSlot i;
  TrackAllocData local_c8;
  Type local_9c;
  code *local_98;
  undefined8 local_90;
  TrackAllocData local_88;
  unsigned_short local_5a;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler;
  AsmJsFunc *func_local;
  AsmJsFunctionInfo *this_local;
  
  recycler = (Recycler *)func;
  func_local = (AsmJsFunc *)this;
  pFVar2 = AsmJsFunc::GetFuncBody(func);
  AsmJsFunc::CommitToFunctionInfo(func,this,pFVar2);
  pFVar2 = AsmJsFunc::GetFuncBody((AsmJsFunc *)recycler);
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar2);
  local_20 = ScriptContext::GetRecycler(this_00);
  AVar1 = AsmJsFunctionDeclaration::GetArgCount((AsmJsFunctionDeclaration *)recycler);
  pRVar3 = local_20;
  this->mArgCount = AVar1;
  if (this->mArgCount != 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&AsmJsVarType::Which::typeinfo,0,(ulong)this->mArgCount,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
               ,0x338);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_48);
    local_58 = Memory::Recycler::AllocLeaf;
    local_50 = 0;
    ptr = Memory::AllocateArray<Memory::Recycler,Js::AsmJsVarType::Which,false>
                    ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocLeaf,0,
                     (ulong)this->mArgCount);
    Memory::WriteBarrierPtr<Js::AsmJsVarType::Which>::operator=(&this->mArgType,ptr);
  }
  local_5a = 3;
  puVar4 = max<unsigned_short>(&this->mArgCount,&local_5a);
  pRVar3 = local_20;
  this->mArgSizesLength = *puVar4;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_88,(type_info *)&unsigned_int::typeinfo,0,(ulong)this->mArgSizesLength,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
             ,0x33e);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_88);
  local_98 = Memory::Recycler::AllocLeafZero;
  local_90 = 0;
  ptr_00 = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                     ((Memory *)pRVar3,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                      (ulong)this->mArgSizesLength);
  Memory::WriteBarrierPtr<unsigned_int>::operator=(&this->mArgSizes,ptr_00);
  local_9c = (Type)AsmJsFunctionDeclaration::GetReturnType((AsmJsFunctionDeclaration *)recycler);
  pRVar3 = local_20;
  (this->mReturnType).which_ = local_9c;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_c8,
             (type_info *)
             &JsUtil::
              BaseDictionary<int,long,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsTypes.cpp"
             ,0x341);
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_c8);
  this_01 = (BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar3,0x43c4b0);
  JsUtil::
  BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_01,local_20,0);
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<int,_long,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::operator=(&this->mbyteCodeTJMap,this_01);
  local_da = 0;
  while( true ) {
    AVar1 = GetArgCount(this);
    if (AVar1 <= local_da) break;
    pAVar5 = AsmJsFunctionDeclaration::GetArgType((AsmJsFunctionDeclaration *)recycler,local_da);
    type = AsmJsVarType::FromCheckedType((AsmJsType)pAVar5->which_);
    SetArgType(this,type,local_da);
    local_da = local_da + 1;
  }
  return true;
}

Assistant:

bool AsmJsFunctionInfo::Init(AsmJsFunc* func)
    {
        func->CommitToFunctionInfo(this, func->GetFuncBody());

        Recycler* recycler = func->GetFuncBody()->GetScriptContext()->GetRecycler();
        mArgCount = func->GetArgCount();
        if (mArgCount > 0)
        {
            mArgType = RecyclerNewArrayLeaf(recycler, AsmJsVarType::Which, mArgCount);
        }

        // on x64, AsmJsExternalEntryPoint reads first 3 elements to figure out how to shadow args on stack
        // always alloc space for these such that we need to do less work in the entrypoint
        mArgSizesLength = max(mArgCount, 3ui16);
        mArgSizes = RecyclerNewArrayLeafZ(recycler, uint, mArgSizesLength);

        mReturnType = func->GetReturnType();
        mbyteCodeTJMap = RecyclerNew(recycler, ByteCodeToTJMap,recycler);

        for(ArgSlot i = 0; i < GetArgCount(); i++)
        {
            AsmJsType varType = func->GetArgType(i);
            SetArgType(AsmJsVarType::FromCheckedType(varType), i);
        }

        return true;
    }